

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Lexer::ErrorWriteDetails(Lexer *this)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  String markerText;
  String lineText;
  
  pcVar2 = this->m_start;
  pcVar6 = pcVar2;
  while (pcVar2 < this->m_current) {
    cVar1 = *pcVar2;
    pcVar2 = pcVar2 + 1;
    if (cVar1 == '\n') {
      pcVar6 = pcVar2;
    }
    if (cVar1 == '\r') {
      pcVar6 = pcVar2;
    }
  }
  uVar4 = 0;
  for (; (pcVar6 < this->m_current && ((cVar1 = *pcVar6, cVar1 == ' ' || (cVar1 == '\t'))));
      pcVar6 = pcVar6 + 1) {
    uVar4 = uVar4 + (ulong)(cVar1 == '\t') * 3 + 1;
  }
  lineText._M_dataplus._M_p = (pointer)&lineText.field_2;
  lineText._M_string_length = 0;
  lineText.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (&lineText,0x20);
  for (; ((pcVar6 < this->m_end && (cVar1 = *pcVar6, cVar1 != '\n')) && (cVar1 != '\r'));
      pcVar6 = pcVar6 + 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::push_back
              (&lineText,cVar1);
  }
  LogWriteLine(Error,lineText._M_dataplus._M_p);
  markerText._M_dataplus._M_p = (pointer)&markerText.field_2;
  markerText._M_string_length = 0;
  markerText.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (&markerText,0x20);
  uVar5 = 0;
  while( true ) {
    uVar3 = 0;
    if (uVar4 <= this->m_columnMarker) {
      uVar3 = this->m_columnMarker - uVar4;
    }
    if (uVar3 <= uVar5) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
              (&markerText," ");
    uVar5 = uVar5 + 1;
  }
  lVar7 = 3;
  while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
              (&markerText,"^");
  }
  LogWriteLine(Error,markerText._M_dataplus._M_p);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&markerText);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&lineText);
  return;
}

Assistant:

inline_t void Lexer::ErrorWriteDetails() const
	{
		// Get line start position
		const char * current = m_start;
		const char * lineStart = m_start;
		while (current < m_current)
		{
			if (IsNewline(*current))
				lineStart = current + 1;
			++current;
		}
		size_t whitespaceOffset = 0;
		while (lineStart < m_current && IsWhitespace(*lineStart))
		{
			if (*lineStart == '\t')
				whitespaceOffset += 4;
			else
				++whitespaceOffset;
			++lineStart;
		}

		// Find line end
		String lineText;
		lineText.reserve(32);
		while (lineStart < m_end && !IsNewline(*lineStart))
		{
			lineText += *lineStart;
			++lineStart;
		}

		// Write line text
		LogWriteLine(LogLevel::Error, lineText.c_str());

		// Write marker showing location of error
		String markerText;
		markerText.reserve(32);
		for (size_t i = 0; i < std::max(size_t(m_columnMarker), whitespaceOffset) - whitespaceOffset; ++i)
			markerText += " ";
		for (size_t i = 0; i < 3; ++i)
			markerText += "^";
		LogWriteLine(LogLevel::Error, markerText.c_str());
	}